

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusPreviousWindowIgnoringOne(ImGuiWindow *ignore_window)

{
  ImGuiWindow *pIVar1;
  long lVar2;
  ImGuiWindow *window;
  
  lVar2 = (long)(GImGui->WindowsFocusOrder).Size;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    do {
      pIVar1 = (GImGui->WindowsFocusOrder).Data[lVar2 + -2];
      if (((pIVar1 != ignore_window) && (pIVar1->WasActive == true)) &&
         ((~pIVar1->Flags & 0x40200U) != 0 && (pIVar1->Flags & 0x1000000U) == 0)) {
        window = pIVar1->NavLastChildNavWindow;
        if (pIVar1->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          window = pIVar1;
        }
        FocusWindow(window);
        return;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void ImGui::FocusPreviousWindowIgnoringOne(ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size - 1; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
}